

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  ulong uVar2;
  bool bVar3;
  string *output;
  undefined8 *puVar4;
  LocationRecorder location;
  LocationRecorder value_location;
  undefined1 local_58 [32];
  LocationRecorder local_38;
  
  if (((field->_has_bits_).has_bits_[0] & 0x10) != 0) {
    local_58._0_8_ = (Parser *)(local_58 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Already set option \"json_name\".","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_58);
    }
    this->had_errors_ = true;
    if ((Parser *)local_58._0_8_ != (Parser *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
    internal::ArenaStringPtr::ClearToEmpty(&field->json_name_);
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] & 0xef;
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_58,field_location,10);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_58,&field->super_Message,OPTION_NAME);
  bVar3 = Consume(this,"json_name");
  if (bVar3) {
    bVar3 = Consume(this,"=");
    if (bVar3) {
      LocationRecorder::LocationRecorder(&local_38,(LocationRecorder *)local_58);
      LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,OPTION_VALUE);
      *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 0x10;
      uVar2 = (field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        puVar4 = (undefined8 *)*puVar4;
      }
      output = internal::ArenaStringPtr::Mutable_abi_cxx11_(&field->json_name_,puVar4);
      bVar3 = ConsumeString(this,output,"Expected string for JSON name.");
      LocationRecorder::~LocationRecorder(&local_38);
      goto LAB_003455e5;
    }
  }
  bVar3 = false;
LAB_003455e5:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
  return bVar3;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}